

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O0

void __thiscall double_conversion::Bignum::SubtractTimes(Bignum *this,Bignum *other,int factor)

{
  Chunk CVar1;
  uint uVar2;
  Chunk *pCVar3;
  ulong uVar4;
  int in_EDX;
  Bignum *in_RSI;
  Bignum *in_RDI;
  Chunk difference_1;
  int i_2;
  Chunk difference;
  DoubleChunk remove;
  DoubleChunk product;
  int i_1;
  int exponent_diff;
  Chunk borrow;
  int i;
  Bignum *in_stack_ffffffffffffffa0;
  int local_40;
  Bignum *in_stack_ffffffffffffffc8;
  Bignum *in_stack_ffffffffffffffd0;
  int local_24;
  uint local_1c;
  int local_18;
  
  if (in_EDX < 3) {
    for (local_18 = 0; local_18 < in_EDX; local_18 = local_18 + 1) {
      SubtractBignum(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    }
  }
  else {
    local_1c = 0;
    local_40 = (int)in_RSI->exponent_ - (int)in_RDI->exponent_;
    for (local_24 = 0; local_24 < in_RSI->used_bigits_; local_24 = local_24 + 1) {
      in_stack_ffffffffffffffa0 = (Bignum *)(long)in_EDX;
      pCVar3 = RawBigit(in_RSI,local_24);
      uVar4 = (ulong)local_1c + (long)in_stack_ffffffffffffffa0 * (ulong)*pCVar3;
      pCVar3 = RawBigit(in_RDI,local_24 + local_40);
      uVar2 = *pCVar3 - ((uint)uVar4 & 0xfffffff);
      pCVar3 = RawBigit(in_RDI,local_24 + local_40);
      *pCVar3 = uVar2 & 0xfffffff;
      local_1c = (int)(uVar4 >> 0x1c) - ((int)uVar2 >> 0x1f);
    }
    for (local_40 = in_RSI->used_bigits_ + local_40; local_40 < in_RDI->used_bigits_;
        local_40 = local_40 + 1) {
      if (local_1c == 0) {
        return;
      }
      pCVar3 = RawBigit(in_RDI,local_40);
      CVar1 = *pCVar3;
      pCVar3 = RawBigit(in_RDI,local_40);
      *pCVar3 = CVar1 - local_1c & 0xfffffff;
      local_1c = CVar1 - local_1c >> 0x1f;
    }
    Clamp(in_stack_ffffffffffffffa0);
  }
  return;
}

Assistant:

void Bignum::SubtractTimes(const Bignum& other, const int factor) {
  DOUBLE_CONVERSION_ASSERT(exponent_ <= other.exponent_);
  if (factor < 3) {
    for (int i = 0; i < factor; ++i) {
      SubtractBignum(other);
    }
    return;
  }
  Chunk borrow = 0;
  const int exponent_diff = other.exponent_ - exponent_;
  for (int i = 0; i < other.used_bigits_; ++i) {
    const DoubleChunk product = static_cast<DoubleChunk>(factor) * other.RawBigit(i);
    const DoubleChunk remove = borrow + product;
    const Chunk difference = RawBigit(i + exponent_diff) - (remove & kBigitMask);
    RawBigit(i + exponent_diff) = difference & kBigitMask;
    borrow = static_cast<Chunk>((difference >> (kChunkSize - 1)) +
                                (remove >> kBigitSize));
  }
  for (int i = other.used_bigits_ + exponent_diff; i < used_bigits_; ++i) {
    if (borrow == 0) {
      return;
    }
    const Chunk difference = RawBigit(i) - borrow;
    RawBigit(i) = difference & kBigitMask;
    borrow = difference >> (kChunkSize - 1);
  }
  Clamp();
}